

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O2

string * __thiscall
calculator::Number::toString_abi_cxx11_(string *__return_storage_ptr__,Number *this)

{
  std::__cxx11::to_string(__return_storage_ptr__,this->__value);
  return __return_storage_ptr__;
}

Assistant:

std::string toString() { return std::to_string(__value); }